

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_global_heaps(Impl *this)

{
  undefined8 uVar1;
  _func_void_void_ptr_LogLevel_char_ptr *p_Var2;
  bool bVar3;
  int iVar4;
  Id IVar5;
  iterator iVar6;
  iterator iVar7;
  reference ppAVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  byte local_2281;
  uint local_2268;
  undefined1 local_2262;
  bool local_2261;
  undefined1 local_2254 [8];
  BindlessInfo tmp_info;
  undefined1 local_2218 [8];
  AliasedAccess aliased_access;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  VulkanCBVBinding vulkan_cbv_binding;
  BindlessInfo counter_info;
  VulkanBinding *counter_binding;
  D3DUAVBinding d3d_uav_binding;
  VulkanUAVBinding vulkan_uav_binding;
  VulkanSRVBinding vulkan_srv_binding;
  bool bStack_f4;
  bool bStack_f3;
  bool bStack_f2;
  bool remap_success;
  VulkanBinding vulkan_binding;
  D3DBinding d3d_binding;
  uint alignment;
  uint stride;
  undefined1 local_b4 [6];
  ComponentType effective_component_type;
  ComponentType actual_component_type;
  BindlessInfo info;
  AnnotateHandleReference *annotation;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<AnnotateHandleReference_*> *__range1_1;
  value_type local_58;
  reference local_50;
  pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference> *use;
  iterator __end1;
  iterator __begin1;
  UnorderedMap<const_LLVMBC::Value_*,_AnnotateHandleReference> *__range1;
  Vector<AnnotateHandleReference_*> annotations;
  Impl *this_local;
  
  annotations.
  super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
  ::vector((vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
            *)&__range1);
  __end1 = std::
           unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AnnotateHandleReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>_>
           ::begin(&this->llvm_annotate_handle_uses);
  use = (pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference> *)
        std::
        unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AnnotateHandleReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>_>
        ::end(&this->llvm_annotate_handle_uses);
  while (bVar3 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
                            ,(_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
                              *)&use), bVar3) {
    local_50 = std::__detail::
               _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false,_false>
               ::operator*(&__end1);
    local_58 = &local_50->second;
    std::
    vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
    ::push_back((vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                 *)&__range1,&local_58);
    std::__detail::
    _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false,_false>
    ::operator++(&__end1);
  }
  iVar6 = std::
          vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
          ::begin((vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                   *)&__range1);
  iVar7 = std::
          vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
          ::end((vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                 *)&__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,dxil_spv::Converter::Impl::emit_global_heaps()::__0>
            (iVar6._M_current,iVar7._M_current);
  __end1_1 = std::
             vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
             ::begin((vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                      *)&__range1);
  annotation = (AnnotateHandleReference *)
               std::
               vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
               ::end((vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                      *)&__range1);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference_**,_std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>_>
                        *)&annotation);
    if (!bVar3) {
      this_local._7_1_ = 1;
LAB_0013faaf:
      std::
      vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
      ::~vector((vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                 *)&__range1);
      return (bool)(this_local._7_1_ & 1);
    }
    ppAVar8 = __gnu_cxx::
              __normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference_**,_std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>_>
              ::operator*(&__end1_1);
    info._28_8_ = *ppAVar8;
    memset(local_b4,0,0x24);
    stride._3_1_ = U32;
    info.raw_vecsize = V1;
    if (((*(char *)(info._28_8_ + 5) == '\x02') || (*(char *)(info._28_8_ + 4) == '\v')) ||
       (*(char *)(info._28_8_ + 4) == '\f')) {
      if (*(char *)(info._28_8_ + 5) == '\x01') {
        info.raw_vecsize = 0x21;
      }
    }
    else {
      stride._3_1_ = normalize_component_type(*(ComponentType *)(info._28_8_ + 6));
      if ((*(byte *)(info._28_8_ + 10) & 1) != 0) {
        stride._3_1_ = U64;
      }
    }
    local_b4[1] = get_effective_typed_resource_type(stride._3_1_);
    local_b4[0] = *(ResourceType *)(info._28_8_ + 5);
    info.type = *(ResourceType *)(info._28_8_ + 4);
    local_2261 = false;
    if (stride._3_1_ != local_b4[1]) {
      local_2261 = component_type_is_16bit(stride._3_1_);
    }
    info.descriptor_type._2_1_ = local_2261;
    if (local_b4[0] == UAV) {
      if ((*(byte *)(info._28_8_ + 0x30) & 1) != 0) {
        (this->execution_mode_meta).declares_globallycoherent_uav = true;
      }
      if ((*(byte *)(info._28_8_ + 0x31) & 1) != 0) {
        (this->execution_mode_meta).declares_rov = true;
      }
      if (((this->shader_analysis).require_uav_thread_group_coherence & 1U) != 0) {
        *(undefined1 *)(info._28_8_ + 0x30) = 1;
      }
      if ((*(char *)(info._28_8_ + 4) == '\f') || (*(char *)(info._28_8_ + 4) == '\v')) {
        *(undefined1 *)(info._28_8_ + 7) = 1;
        *(undefined1 *)(info._28_8_ + 8) = 1;
      }
      local_2262 = 1;
      if ((*(byte *)(info._28_8_ + 0x30) & 1) == 0) {
        local_2262 = *(byte *)(info._28_8_ + 0x31);
      }
      info.format._2_1_ = local_2262 & 1;
      info.format._0_1_ = *(byte *)(info._28_8_ + 7) & ImageFormatRgba32f;
      info.format._1_1_ = *(byte *)(info._28_8_ + 8) & 1;
      bVar3 = get_uav_image_format
                        (this,*(ResourceKind *)(info._28_8_ + 4),stride._3_1_,
                         (AccessTracking *)(info._28_8_ + 7),&info.raw_vecsize);
      if (!bVar3) {
        this_local._7_1_ = 0;
        goto LAB_0013faaf;
      }
    }
    if (info.type == 0xb) {
      local_2268 = 0x10;
    }
    else {
      local_2268 = *(uint *)(info._28_8_ + 0x2c) & -*(uint *)(info._28_8_ + 0x2c);
    }
    vulkan_binding.bindless._4_4_ = get_remapping_stage(this->execution_model);
    vulkan_binding.descriptor_type = CONCAT31(vulkan_binding.descriptor_type._1_3_,info.type);
    memset(&vulkan_srv_binding.offset_binding.descriptor_type,0,0x18);
    vulkan_srv_binding.offset_binding.bindless._7_1_ = 0;
    if (this->resource_mapping_iface != (ResourceRemappingInterface *)0x0) {
      switch(local_b4[0]) {
      case SRV:
        memset(&vulkan_uav_binding.offset_binding.bindless.use_heap,0,0x30);
        iVar4 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[2])
                          (this->resource_mapping_iface,&vulkan_binding.bindless.use_heap,
                           &vulkan_uav_binding.offset_binding.bindless.use_heap);
        vulkan_srv_binding.offset_binding.bindless._7_1_ = (byte)iVar4 & 1;
        stack0xffffffffffffff08 =
             (_func_void_void_ptr_LogLevel_char_ptr *)vulkan_uav_binding.offset_binding._16_8_;
        vulkan_binding.descriptor_set = vulkan_srv_binding.buffer_binding.descriptor_set;
        vulkan_binding.binding = vulkan_srv_binding.buffer_binding.binding;
        vulkan_binding.root_constant_index = vulkan_srv_binding.buffer_binding.root_constant_index;
        vulkan_binding.bindless.heap_root_offset =
             vulkan_srv_binding.buffer_binding.bindless.heap_root_offset;
        bVar3 = get_ssbo_offset_buffer_id
                          (this,(Id *)(info._28_8_ + 0xb8),
                           (VulkanBinding *)&vulkan_uav_binding.offset_binding.bindless.use_heap,
                           (VulkanBinding *)&vulkan_srv_binding.buffer_binding.bindless.use_heap,
                           *(ResourceKind *)(info._28_8_ + 4),local_2268);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_0013faaf;
        }
        break;
      case UAV:
        memset(&d3d_uav_binding.binding.alignment,0,0x48);
        memset((void *)((long)&counter_binding + 4),0,0x20);
        unique0x1000044b = CONCAT44(vulkan_binding.descriptor_type,vulkan_binding.bindless._4_4_);
        d3d_uav_binding.binding.stage = Unknown;
        d3d_uav_binding.binding.kind = ~Invalid;
        d3d_uav_binding.binding._5_3_ = 0xffffff;
        d3d_uav_binding.binding.resource_index = 0xffffffff;
        d3d_uav_binding.binding.register_space = 0xffffffff;
        d3d_uav_binding.binding.register_index = local_2268;
        d3d_uav_binding.binding.range_size._0_1_ = *(byte *)(info._28_8_ + 0x32) & 1;
        iVar4 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[4])
                          (this->resource_mapping_iface,(long)&counter_binding + 4,
                           &d3d_uav_binding.binding.alignment);
        vulkan_srv_binding.offset_binding.bindless._7_1_ = (byte)iVar4 & 1;
        stack0xffffffffffffff08 = (_func_void_void_ptr_LogLevel_char_ptr *)d3d_uav_binding._24_8_;
        vulkan_binding.descriptor_set = vulkan_uav_binding.buffer_binding.descriptor_set;
        vulkan_binding.binding = vulkan_uav_binding.buffer_binding.binding;
        vulkan_binding.root_constant_index = vulkan_uav_binding.buffer_binding.root_constant_index;
        vulkan_binding.bindless.heap_root_offset =
             vulkan_uav_binding.buffer_binding.bindless.heap_root_offset;
        bVar3 = get_ssbo_offset_buffer_id
                          (this,(Id *)(info._28_8_ + 0xb8),
                           (VulkanBinding *)&d3d_uav_binding.binding.alignment,
                           (VulkanBinding *)&vulkan_uav_binding.counter_binding.bindless.use_heap,
                           *(ResourceKind *)(info._28_8_ + 4),local_2268);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_0013faaf;
        }
        if ((*(byte *)(info._28_8_ + 0x32) & 1) != 0) {
          memset((void *)((long)&vulkan_cbv_binding.field_0 + 0x14),0,0x24);
          *(undefined1 *)(info._28_8_ + 0xa9) = 1;
          *(undefined4 *)(info._28_8_ + 0x9c) = 0xffffffff;
          *(undefined4 *)(info._28_8_ + 0xa4) = 4;
          *(undefined1 *)(info._28_8_ + 0xa8) = 1;
          vulkan_cbv_binding.field_0.buffer.descriptor_type._0_1_ = 1;
          vulkan_cbv_binding.field_0.buffer.descriptor_type._1_1_ = 5;
          if ((((this->options).physical_storage_buffer & 1U) == 0) ||
             (vulkan_uav_binding.counter_binding.bindless.heap_root_offset == 2)) {
            *(undefined1 *)(info._28_8_ + 0xad) = 10;
          }
          else {
            *(undefined1 *)(info._28_8_ + 0xad) = 0xb;
          }
          IVar5 = create_bindless_heap_variable
                            (this,(BindlessInfo *)((long)&vulkan_cbv_binding.field_0 + 0x14));
          *(Id *)(info._28_8_ + 0x78) = IVar5;
        }
        break;
      case CBV:
        memset(&cb,0,0x1c);
        iVar4 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[5])
                          (this->resource_mapping_iface,&vulkan_binding.bindless.use_heap,&cb);
        vulkan_srv_binding.offset_binding.bindless._7_1_ = (byte)iVar4 & 1;
        if ((vulkan_cbv_binding.field_0.buffer.bindless.use_heap & 1U) != 0) {
          buffer._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Cannot use push constants for SM 6.6 bindless.\n");
            fflush(_stderr);
          }
          else {
            snprintf((char *)&cb_1,0x1000,"Cannot use push constants for SM 6.6 bindless.\n");
            uVar1 = buffer._4088_8_;
            pvVar10 = get_thread_log_callback_userdata();
            (*(code *)uVar1)(pvVar10,2,&cb_1);
          }
          this_local._7_1_ = 0;
          goto LAB_0013faaf;
        }
        stack0xffffffffffffff08 = cb;
        vulkan_binding.descriptor_set = vulkan_cbv_binding.field_0._0_4_;
        vulkan_binding.binding = vulkan_cbv_binding.field_0._4_4_;
        vulkan_binding.root_constant_index = (uint)vulkan_cbv_binding.field_0._8_8_;
        vulkan_binding.bindless.heap_root_offset = 4;
        break;
      case Sampler:
        iVar4 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[3])
                          (this->resource_mapping_iface,&vulkan_binding.bindless.use_heap,
                           &vulkan_srv_binding.offset_binding.descriptor_type);
        vulkan_srv_binding.offset_binding.bindless._7_1_ = (byte)iVar4 & 1;
      }
    }
    if ((vulkan_srv_binding.offset_binding.bindless._7_1_ & 1) == 0) {
      this_local._7_1_ = 0;
      goto LAB_0013faaf;
    }
    if ((vulkan_binding._8_8_ & 1) == 0) {
      p_Var9 = get_thread_log_callback();
      if (p_Var9 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: SM 6.6 bindless references must be bindless.\n");
        fflush(_stderr);
      }
      else {
        snprintf(&aliased_access.requires_alias_decoration,0x1000,
                 "SM 6.6 bindless references must be bindless.\n");
        pvVar10 = get_thread_log_callback_userdata();
        (*p_Var9)(pvVar10,Error,&aliased_access.requires_alias_decoration);
      }
      this_local._7_1_ = 0;
      goto LAB_0013faaf;
    }
    AliasedAccess::AliasedAccess((AliasedAccess *)local_2218);
    bVar3 = analyze_aliased_access
                      (this,(AccessTracking *)(info._28_8_ + 7),
                       vulkan_binding.bindless.heap_root_offset,(AliasedAccess *)local_2218);
    p_Var2 = stack0xffffffffffffff08;
    if (bVar3) {
      info.uav_read = (bool)(undefined1)vulkan_srv_binding.offset_binding.descriptor_type;
      info.uav_written = (bool)vulkan_srv_binding.offset_binding.descriptor_type._1_1_;
      info.uav_coherent = (bool)vulkan_srv_binding.offset_binding.descriptor_type._2_1_;
      info.counters = (bool)vulkan_srv_binding.offset_binding.descriptor_type._3_1_;
      _bStack_f4 = SUB84(p_Var2,4);
      info.offsets = bStack_f4;
      info.aliased = bStack_f3;
      info.relaxed_precision = bStack_f2;
      info._27_1_ = remap_success;
      info._8_4_ = vulkan_binding.bindless.heap_root_offset;
      info.descriptor_type._1_1_ =
           aliased_access.raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ & 1;
      *(undefined1 *)(info._28_8_ + 0x68) = 1;
      *(undefined1 *)(info._28_8_ + 0x69) = 1;
      *(undefined4 *)(info._28_8_ + 0x5c) = 0xffffffff;
      *(undefined4 *)(info._28_8_ + 100) = *(undefined4 *)(info._28_8_ + 0x2c);
      *(undefined1 *)(info._28_8_ + 0x6d) = *(undefined1 *)(info._28_8_ + 4);
      local_2281 = 1;
      if ((*(byte *)(info._28_8_ + 0x30) & 1) == 0) {
        local_2281 = *(byte *)(info._28_8_ + 0x31);
      }
      *(byte *)(info._28_8_ + 0x6b) = local_2281 & 1;
      *(byte *)(info._28_8_ + 0x6c) = *(byte *)(info._28_8_ + 0x31) & 1;
      unique0x10000a04 = p_Var2;
      if ((aliased_access.raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ & 1) == Identity >> 8) {
        if ((aliased_access.raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ & 1) == 0) {
          IVar5 = create_bindless_heap_variable(this,(BindlessInfo *)local_b4);
          *(Id *)(info._28_8_ + 0x38) = IVar5;
        }
        else {
          memcpy(local_2254,local_b4,0x24);
          local_2254[1] =
               aliased_access.raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_;
          local_2254._4_4_ =
               aliased_access.raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          IVar5 = create_bindless_heap_variable(this,(BindlessInfo *)local_2254);
          *(Id *)(info._28_8_ + 0x38) = IVar5;
        }
      }
      else {
        create_bindless_heap_variable_alias_group
                  ((Vector<Converter::Impl::RawDeclarationVariable> *)&tmp_info.desc_set,this,
                   (BindlessInfo *)local_b4,(Vector<RawDeclaration> *)local_2218);
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::operator=((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     *)(info._28_8_ + 0x40),
                    (vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     *)&tmp_info.desc_set);
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::~vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&tmp_info.desc_set);
      }
      *(undefined1 *)(info._28_8_ + 0x58) =
           aliased_access.raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ & 1;
      bVar3 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    AliasedAccess::~AliasedAccess((AliasedAccess *)local_2218);
    if (bVar3) goto LAB_0013faaf;
    __gnu_cxx::
    __normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference_**,_std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool Converter::Impl::emit_global_heaps()
{
	Vector<AnnotateHandleReference *> annotations;
	for (auto &use : llvm_annotate_handle_uses)
		annotations.push_back(&use.second);

	// Ensure reproducible codegen since we iterate over an unordered map.
	std::sort(annotations.begin(), annotations.end(),
	          [](const AnnotateHandleReference *a, const AnnotateHandleReference *b) {
	              return a->ordinal < b->ordinal;
	          });

	for (auto *annotation : annotations)
	{
		BindlessInfo info = {};

		auto actual_component_type = DXIL::ComponentType::U32;
		info.format = spv::ImageFormatUnknown;
		if (annotation->resource_type != DXIL::ResourceType::CBV &&
		    annotation->resource_kind != DXIL::ResourceKind::RawBuffer &&
		    annotation->resource_kind != DXIL::ResourceKind::StructuredBuffer)
		{
			actual_component_type = normalize_component_type(annotation->component_type);
			if (annotation->tracking.has_atomic_64bit)
			{
				// The component type in DXIL is u32, even if the resource itself is u64 in meta reflection data ...
				// This is also the case for signed components. Always use R64UI here.
				actual_component_type = DXIL::ComponentType::U64;
			}
		}
		else if (annotation->resource_type == DXIL::ResourceType::UAV)
		{
			info.format = spv::ImageFormatR32ui;
		}

		auto effective_component_type = get_effective_typed_resource_type(actual_component_type);

		info.type = annotation->resource_type;
		info.component = effective_component_type;
		info.kind = annotation->resource_kind;
		info.relaxed_precision = actual_component_type != effective_component_type &&
		                         component_type_is_16bit(actual_component_type);

		if (info.type == DXIL::ResourceType::UAV)
		{
			// See emit_uavs() for details around coherent and memory model shenanigans ...
			if (annotation->coherent)
				execution_mode_meta.declares_globallycoherent_uav = true;
			if (annotation->rov)
				execution_mode_meta.declares_rov = true;

			// Do not attempt to track read and write here to figure out if this resource in particular needs to be coherent.
			// It's plausible that the write and read can happen across
			// two different accesses to ResourceDescriptorHeap[]. Don't take any chances here ...
			if (shader_analysis.require_uav_thread_group_coherence)
				annotation->coherent = true;

			if (annotation->resource_kind == DXIL::ResourceKind::StructuredBuffer ||
			    annotation->resource_kind == DXIL::ResourceKind::RawBuffer)
			{
				// In case there is aliasing through different declarations,
				// we cannot emit NonWritable or NonReadable safely. Assume full read-write.
				// Be a bit careful with typed resources since it's not always supported with read-write + typed.
				annotation->tracking.has_read = true;
				annotation->tracking.has_written = true;
			}

			info.uav_coherent = annotation->coherent || annotation->rov;
			info.uav_read = annotation->tracking.has_read;
			info.uav_written = annotation->tracking.has_written;
			if (!get_uav_image_format(annotation->resource_kind, actual_component_type,
			                          annotation->tracking, info.format))
			{
				return false;
			}
		}

		unsigned stride = annotation->stride;
		unsigned alignment = info.kind == DXIL::ResourceKind::RawBuffer ? 16 : (stride & -int(stride));
		D3DBinding d3d_binding = {
			get_remapping_stage(execution_model), info.kind, 0,
			UINT32_MAX, UINT32_MAX, UINT32_MAX, alignment,
		};
		VulkanBinding vulkan_binding = {};

		bool remap_success = false;
		if (resource_mapping_iface)
		{
			switch (info.type)
			{
			case DXIL::ResourceType::SRV:
			{
				VulkanSRVBinding vulkan_srv_binding = {};
				remap_success = resource_mapping_iface->remap_srv(d3d_binding, vulkan_srv_binding);
				vulkan_binding = vulkan_srv_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_srv_binding.buffer_binding,
				                               vulkan_srv_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}
				break;
			}

			case DXIL::ResourceType::UAV:
			{
				VulkanUAVBinding vulkan_uav_binding = {};
				D3DUAVBinding d3d_uav_binding = {};

				d3d_uav_binding.binding = d3d_binding;
				d3d_uav_binding.counter = annotation->counter;

				remap_success = resource_mapping_iface->remap_uav(d3d_uav_binding, vulkan_uav_binding);
				vulkan_binding = vulkan_uav_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_uav_binding.buffer_binding,
											   vulkan_uav_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}

				if (annotation->counter)
				{
					auto &counter_binding = vulkan_uav_binding.counter_binding;
					BindlessInfo counter_info = {};

					annotation->counter_reference.base_resource_is_array = true;
					annotation->counter_reference.push_constant_member = UINT32_MAX;
					annotation->counter_reference.stride = 4;
					annotation->counter_reference.bindless = true;

					counter_info.type = DXIL::ResourceType::UAV;
					counter_info.component = DXIL::ComponentType::U32;
					counter_info.desc_set = counter_binding.descriptor_set;
					counter_info.binding = counter_binding.binding;

					if (options.physical_storage_buffer &&
					    counter_binding.descriptor_type != VulkanDescriptorType::TexelBuffer)
					{
						counter_info.kind = DXIL::ResourceKind::Invalid;
						counter_info.counters = true;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::RawBuffer;
					}
					else
					{
						counter_info.kind = DXIL::ResourceKind::RawBuffer;
						counter_info.uav_read = true;
						counter_info.uav_written = true;
						counter_info.uav_coherent = false;
						counter_info.format = spv::ImageFormatR32ui;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::TypedBuffer;
					}

					annotation->counter_reference.var_id = create_bindless_heap_variable(counter_info);
				}
				break;
			}

			case DXIL::ResourceType::CBV:
			{
				VulkanCBVBinding vulkan_cbv_binding = {};
				remap_success = resource_mapping_iface->remap_cbv(d3d_binding, vulkan_cbv_binding);
				if (vulkan_cbv_binding.push_constant)
				{
					LOGE("Cannot use push constants for SM 6.6 bindless.\n");
					return false;
				}
				vulkan_binding = vulkan_cbv_binding.buffer;
				vulkan_binding.descriptor_type = VulkanDescriptorType::UBO;
				break;
			}

			case DXIL::ResourceType::Sampler:
				remap_success = resource_mapping_iface->remap_sampler(d3d_binding, vulkan_binding);
				break;
			}
		}

		if (!remap_success)
			return false;

		if (!vulkan_binding.bindless.use_heap)
		{
			LOGE("SM 6.6 bindless references must be bindless.\n");
			return false;
		}

		AliasedAccess aliased_access;
		if (!analyze_aliased_access(annotation->tracking, vulkan_binding.descriptor_type, aliased_access))
			return false;

		info.desc_set = vulkan_binding.descriptor_set;
		info.binding = vulkan_binding.binding;
		info.descriptor_type = vulkan_binding.descriptor_type;
		info.aliased = aliased_access.requires_alias_decoration;

		annotation->reference.bindless = true;
		annotation->reference.base_resource_is_array = true;
		annotation->reference.push_constant_member = UINT32_MAX;
		annotation->reference.stride = annotation->stride;
		annotation->reference.resource_kind = annotation->resource_kind;
		annotation->reference.coherent = annotation->coherent || annotation->rov;
		annotation->reference.rov = annotation->rov;

		if (aliased_access.requires_alias_decoration)
		{
			annotation->reference.var_alias_group = create_bindless_heap_variable_alias_group(
			    info, aliased_access.raw_declarations);
		}
		else if (aliased_access.override_primary_component_types)
		{
			auto tmp_info = info;
			tmp_info.component = aliased_access.primary_component_type;
			tmp_info.raw_vecsize = aliased_access.primary_raw_vecsize;
			annotation->reference.var_id = create_bindless_heap_variable(tmp_info);
		}
		else
			annotation->reference.var_id = create_bindless_heap_variable(info);

		annotation->reference.aliased = aliased_access.requires_alias_decoration;
	}

	return true;
}